

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::log_internal::anon_unknown_0::GlobalLogSinkSet::AddLogSink
          (GlobalLogSinkSet *this,LogSink *sink)

{
  __normal_iterator<absl::lts_20250127::LogSink_**,_std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>_>
  _Var1;
  WriterMutexLock global_sinks_lock;
  WriterMutexLock local_28;
  GlobalLogSinkSet *local_20;
  int local_18 [2];
  
  local_28.mu_ = (Mutex *)&GlobalSinks::global_sinks;
  local_20 = this;
  Mutex::Lock((Mutex *)&GlobalSinks::global_sinks);
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<absl::lts_20250127::LogSink**,std::vector<absl::lts_20250127::LogSink*,std::allocator<absl::lts_20250127::LogSink*>>>,__gnu_cxx::__ops::_Iter_equals_val<absl::lts_20250127::LogSink*const>>
                    (GlobalSinks::global_sinks.impl_.space_._8_8_,
                     GlobalSinks::global_sinks.impl_.space_._16_8_,&local_20);
  if (_Var1._M_current == (LogSink **)GlobalSinks::global_sinks.impl_.space_._16_8_) {
    std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>::
    push_back((vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>
               *)(GlobalSinks::global_sinks.impl_.space_ + 8),(value_type *)&local_20);
    WriterMutexLock::~WriterMutexLock(&local_28);
    return;
  }
  WriterMutexLock::~WriterMutexLock(&local_28);
  local_28.mu_ = (Mutex *)0x44f00c;
  local_18[1] = 3;
  local_18[0] = 0xd7;
  base_internal::
  AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::
  operator()((AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
              *)&raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_18 + 1),
             (char **)&local_28,local_18,(char (*) [38])"Duplicate log sinks are not supported");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/log/internal/log_sink_set.cc"
                ,0xd7,
                "void absl::log_internal::(anonymous namespace)::GlobalLogSinkSet::AddLogSink(absl::LogSink *)"
               );
}

Assistant:

ABSL_LOCKS_EXCLUDED(guard_) {
    {
      absl::WriterMutexLock global_sinks_lock(&guard_);
      auto pos = std::find(sinks_.begin(), sinks_.end(), sink);
      if (pos == sinks_.end()) {
        sinks_.push_back(sink);
        return;
      }
    }
    ABSL_INTERNAL_LOG(FATAL, "Duplicate log sinks are not supported");
  }